

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O3

UModelIndex * __thiscall
TreeModel::addItem(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 offset,UINT8 type,
                  UINT8 subtype,CBString *name,CBString *text,CBString *info,UByteArray *header,
                  UByteArray *body,UByteArray *tail,ItemFixedState fixed,UModelIndex *parent,
                  UINT8 mode)

{
  size_t *psVar1;
  uint uVar2;
  undefined1 compressed;
  int iVar3;
  TreeItem *pTVar4;
  _List_node_base *p_Var5;
  TreeModel *this_00;
  uint uVar6;
  uint uVar7;
  TreeItem *local_80;
  TreeItem *local_78;
  UModelIndex local_48;
  
  uVar7 = parent->r;
  uVar6 = parent->c;
  this_00 = parent->m;
  if ((int)(uVar6 | uVar7) < 0 || this_00 == (TreeModel *)0x0) {
    local_80 = (TreeItem *)0x0;
    local_78 = this->rootItem;
    uVar2 = 0;
  }
  else {
    local_78 = (TreeItem *)parent->i;
    if ((mode & 0xfe) == 2) {
      pTVar4 = local_78->parentItem;
      TreeModel::parent(&local_48,this_00,parent);
      this_00 = parent->m;
      uVar7 = parent->r;
      uVar6 = parent->c;
      local_80 = local_78;
      local_78 = pTVar4;
      uVar2 = local_48.c;
    }
    else {
      local_80 = (TreeItem *)0x0;
      uVar2 = uVar6;
    }
  }
  pTVar4 = (TreeItem *)operator_new(0x118);
  compressed = false;
  if (((-1 < (int)uVar7) && (compressed = false, -1 < (int)uVar6)) &&
     (compressed = false, this_00 != (TreeModel *)0x0)) {
    compressed = *(undefined1 *)(parent->i + 0xc9);
  }
  TreeItem::TreeItem(pTVar4,offset,type,subtype,name,text,info,header,body,tail,false,
                     (bool)compressed,local_78);
  switch(mode) {
  case '\0':
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)pTVar4;
    break;
  case '\x01':
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)pTVar4;
    break;
  case '\x02':
    TreeItem::insertChildBefore(local_78,local_80,pTVar4);
    goto LAB_00148140;
  case '\x03':
    TreeItem::insertChildAfter(local_78,local_80,pTVar4);
    goto LAB_00148140;
  default:
    TreeItem::~TreeItem(pTVar4);
    operator_delete(pTVar4);
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    __return_storage_ptr__->m = (TreeModel *)0x0;
    return __return_storage_ptr__;
  }
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(local_78->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_00148140:
  iVar3 = TreeItem::row(pTVar4);
  __return_storage_ptr__->r = iVar3;
  __return_storage_ptr__->c = uVar2;
  __return_storage_ptr__->i = (uint64_t)pTVar4;
  __return_storage_ptr__->m = this;
  setFixed(this,__return_storage_ptr__,fixed != Movable);
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::addItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                               const UString & name, const UString & text, const UString & info,
                               const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                               const ItemFixedState fixed,
                               const UModelIndex & parent, const UINT8 mode)
{
    TreeItem *item = 0;
    TreeItem *parentItem = 0;
    int parentColumn = 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
    {
        if (mode == CREATE_MODE_BEFORE || mode == CREATE_MODE_AFTER) {
            item = static_cast<TreeItem*>(parent.internalPointer());
            parentItem = item->parent();
            parentColumn = parent.parent().column();
        }
        else {
            parentItem = static_cast<TreeItem*>(parent.internalPointer());
            parentColumn = parent.column();
        }
    }
    
    TreeItem *newItem = new TreeItem(offset, type, subtype, name, text, info, header, body, tail, Movable, this->compressed(parent), parentItem);
    
    if (mode == CREATE_MODE_APPEND) {
        emit layoutAboutToBeChanged();
        parentItem->appendChild(newItem);
    }
    else if (mode == CREATE_MODE_PREPEND) {
        emit layoutAboutToBeChanged();
        parentItem->prependChild(newItem);
    }
    else if (mode == CREATE_MODE_BEFORE) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildBefore(item, newItem);
    }
    else if (mode == CREATE_MODE_AFTER) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildAfter(item, newItem);
    }
    else {
        delete newItem;
        return UModelIndex();
    }
    
    emit layoutChanged();
    
    UModelIndex created = createIndex(newItem->row(), parentColumn, newItem);
    setFixed(created, (bool)fixed); // Non-trivial logic requires additional call
    return created;
}